

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hierarchic_fe.h
# Opt level: O3

Matrix<double,_1,__1,_1,_1,__1> __thiscall
lf::fe::FeHierarchicSegment<double>::NodalValuesToDofs
          (FeHierarchicSegment<double> *this,Matrix<double,_1,__1,_1,_1,__1> *nodevals)

{
  double dVar1;
  double dVar2;
  uint uVar3;
  double *pdVar4;
  DenseCoeffsBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0> *this_00;
  LhsNested LVar5;
  CoeffReturnType pdVar6;
  Scalar *pSVar7;
  DenseCoeffsBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0> *in_RDX;
  Index extraout_RDX;
  Index extraout_RDX_00;
  Index IVar8;
  ulong blockCols;
  double *pdVar9;
  Index col;
  long lVar10;
  Matrix<double,_1,__1,_1,_1,__1> MVar11;
  Matrix<double,_1,__1,_1,_1,__1> psidd;
  scalar_product_op<double,_double> local_17d;
  uint local_17c;
  FeHierarchicSegment<double> *local_178;
  double local_170;
  Matrix<double,_1,__1,_1,_1,__1> local_168;
  Scalar local_150;
  DenseCoeffsBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0> *local_148;
  double local_140;
  double local_138;
  double local_130;
  Rhs local_128;
  Lhs local_120;
  Rhs local_118;
  Block<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false> local_e0;
  double *local_a8;
  LhsNested local_a0;
  variable_if_dynamic<long,__1> local_78;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Transpose<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>_>
  local_48;
  
  IVar8 = (nodevals->super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>).m_storage.
          m_cols;
  (this->super_ScalarReferenceFiniteElement<double>)._vptr_ScalarReferenceFiniteElement =
       (_func_int **)0x0;
  *(undefined8 *)&this->degree_ = 0;
  local_178 = this;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_> *)this,
             (ulong)((int)IVar8 + 1));
  pdVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0>::operator[](in_RDX,0);
  local_170 = *pdVar6;
  pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1> *)local_178,0);
  *pSVar7 = local_170;
  pdVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0>::operator[](in_RDX,1);
  local_170 = *pdVar6;
  pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1> *)local_178,1);
  *pSVar7 = local_170;
  local_17c = 2;
  IVar8 = extraout_RDX;
  local_148 = in_RDX;
  if ((int)(nodevals->super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>).m_storage.
           m_cols - 2U < 0xfffffffd) {
    do {
      local_170 = ILegendreDx(local_17c,0.0,1.0);
      local_130 = ILegendreDx(local_17c,1.0,1.0);
      local_a8 = nodevals[1].super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.
                 m_storage.m_data + 1;
      local_a0.m_expression.m_matrix = (NestedExpressionType)&local_17c;
      local_168.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.m_data =
           (double *)0x0;
      local_168.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.m_cols = 0;
      Eigen::PlainObjectBase<Eigen::Matrix<double,1,-1,1,1,-1>>::
      resizeLike<Eigen::CwiseUnaryOp<lf::fe::FeHierarchicSegment<double>::NodalValuesToDofs(Eigen::Matrix<double,1,_1,1,1,_1>const&)const::_lambda(double)_1_,Eigen::Matrix<double,_1,_1,0,_1,_1>const>>
                ((PlainObjectBase<Eigen::Matrix<double,1,_1,1,1,_1>> *)&local_168,
                 (EigenBase<Eigen::CwiseUnaryOp<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_fe_hierarchic_fe_h:379:15),_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                  *)&local_a8);
      LVar5.m_expression.m_matrix = local_a0.m_expression.m_matrix;
      pdVar9 = (double *)*local_a8;
      dVar1 = local_a8[1];
      Eigen::internal::
      resize_if_allowed<Eigen::Matrix<double,1,_1,1,1,_1>,Eigen::CwiseUnaryOp<lf::fe::FeHierarchicSegment<double>::NodalValuesToDofs(Eigen::Matrix<double,1,_1,1,1,_1>const&)const::_lambda(double)_1_,Eigen::Matrix<double,_1,_1,0,_1,_1>const>,double,double>
                (&local_168,
                 (CwiseUnaryOp<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_fe_hierarchic_fe_h:379:15),_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                  *)&local_a8,(assign_op<double,_double> *)&local_118);
      pdVar4 = local_168.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.
               m_data;
      if (0 < local_168.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.
              m_cols) {
        lVar10 = 0;
        do {
          dVar2 = LegendreDx(*(uint *)LVar5.m_expression.m_matrix - 1,*pdVar9,1.0);
          pdVar4[lVar10] = dVar2;
          lVar10 = lVar10 + 1;
          pdVar9 = pdVar9 + (long)dVar1;
        } while (lVar10 < local_168.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.
                          m_storage.m_cols);
      }
      local_120.m_expression.m_matrix =
           (NestedExpressionType)
           (nodevals[1].super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.
            m_data + 4);
      local_128.m_expression = &local_168;
      Eigen::
      CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Transpose<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>_>
      ::CwiseBinaryOp(&local_48,&local_120,&local_128,
                      (scalar_product_op<double,_double> *)&local_118);
      this_00 = local_148;
      blockCols = (ulong)*(uint *)(nodevals[1].
                                   super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.
                                   m_storage.m_data + 3);
      Eigen::Block<const_Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_1,_-1,_false>::Block
                (&local_e0,(Matrix<double,_1,__1,_1,_1,__1> *)local_148,0,
                 *(long *)(local_148 + 8) - blockCols,1,blockCols);
      local_118.m_expression.
      super_BlockImpl<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_true>.
      m_outerStride =
           local_e0.
           super_BlockImpl<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_Eigen::Dense>
           .super_BlockImpl_dense<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_true>.
           m_outerStride;
      local_118.m_expression.
      super_BlockImpl<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_true>._32_8_
           = local_e0.
             super_BlockImpl<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_Eigen::Dense>
             .
             super_BlockImpl_dense<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_true>
             ._32_8_;
      local_118.m_expression.
      super_BlockImpl<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_true>.
      m_startCol.m_value =
           local_e0.
           super_BlockImpl<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_Eigen::Dense>
           .super_BlockImpl_dense<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_true>.
           m_startCol.m_value;
      local_118.m_expression.
      super_BlockImpl<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_true>.
      super_MapBase<Eigen::Block<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>,_0>.
      m_cols.m_value =
           local_e0.
           super_BlockImpl<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_Eigen::Dense>
           .super_BlockImpl_dense<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_true>.
           super_MapBase<Eigen::Block<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>,_0>
           .m_cols.m_value;
      local_118.m_expression.
      super_BlockImpl<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_true>.m_xpr
           = local_e0.
             super_BlockImpl<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_Eigen::Dense>
             .
             super_BlockImpl_dense<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_true>
             .m_xpr;
      local_118.m_expression.
      super_BlockImpl<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_true>.
      super_MapBase<Eigen::Block<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>,_0>.
      m_data = local_e0.
               super_BlockImpl<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_Eigen::Dense>
               .
               super_BlockImpl_dense<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_true>
               .
               super_MapBase<Eigen::Block<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>,_0>
               .m_data;
      local_118.m_expression.
      super_BlockImpl<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_true>.
      super_MapBase<Eigen::Block<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>,_0>.
      _8_8_ = local_e0.
              super_BlockImpl<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_Eigen::Dense>
              .
              super_BlockImpl_dense<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false,_true>
              .
              super_MapBase<Eigen::Block<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>,_0>
              ._8_8_;
      Eigen::
      CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Transpose<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_1,_-1,_false>_>_>
      ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Transpose<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::ArrayWrapper<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1,__1,_false>_>_>
                       *)&local_a8,&local_48,&local_118,&local_17d);
      if (local_78.m_value == 0) {
        local_150 = 0.0;
      }
      else {
        local_150 = Eigen::
                    DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Matrix<double,-1,1,0,-1,1>const>const>const,Eigen::ArrayWrapper<Eigen::Matrix<double,1,-1,1,1,-1>const>const>const,Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,1,-1,1,1,-1>const,1,-1,false>const>const>>
                    ::redux<Eigen::internal::scalar_sum_op<double,double>>
                              ((DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Matrix<double,_1,1,0,_1,1>const>const>const,Eigen::ArrayWrapper<Eigen::Matrix<double,1,_1,1,1,_1>const>const>const,Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,1,_1,1,1,_1>const,1,_1,false>const>const>>
                                *)&local_a8,(scalar_sum_op<double,_double> *)&local_17d);
      }
      pdVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0>::operator[]
                         (this_00,1);
      local_138 = *pdVar6;
      pdVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0>::operator[]
                         (this_00,0);
      uVar3 = local_17c;
      local_140 = *pdVar6;
      pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1> *)local_178,
                          (ulong)local_17c);
      *pSVar7 = (double)(uVar3 * 2 - 1) *
                ((local_130 * local_138 - local_140 * local_170) - local_150);
      free(local_168.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.m_data
          );
      local_17c = local_17c + 1;
      IVar8 = extraout_RDX_00;
    } while (local_17c <
             (int)(nodevals->super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>).
                  m_storage.m_cols + 1U);
  }
  MVar11.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.m_cols = IVar8;
  MVar11.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.m_data =
       (double *)local_178;
  return (Matrix<double,_1,__1,_1,_1,__1>)
         MVar11.super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage;
}

Assistant:

[[nodiscard]] Eigen::Matrix<SCALAR, 1, Eigen::Dynamic> NodalValuesToDofs(
      const Eigen::Matrix<SCALAR, 1, Eigen::Dynamic> &nodevals) const override {
    Eigen::Matrix<SCALAR, 1, Eigen::Dynamic> dofs(NumRefShapeFunctions());
    // Compute the first and second basis function coefficients
    dofs[0] = nodevals[0];
    dofs[1] = nodevals[1];
    // Compute the other basis function coefficients
    for (lf::base::size_type i = 2; i < NumRefShapeFunctions(); ++i) {
      const SCALAR P0 = ILegendreDx(i, 0);
      const SCALAR P1 = ILegendreDx(i, 1);
      const Eigen::Matrix<SCALAR, 1, Eigen::Dynamic> psidd =
          qr_dual_->Points().unaryExpr(
              [&](double x) -> SCALAR { return LegendreDx(i - 1, x); });
      // Evaluate the integral from the dual basis
      const SCALAR integ =
          (qr_dual_->Weights().transpose().array() * psidd.array() *
           nodevals.tail(qr_dual_->NumPoints()).array())
              .sum();
      // Compute the basis function coefficient
      dofs[i] = (P1 * nodevals[1] - P0 * nodevals[0] - integ) * (2 * i - 1);
    }
    return dofs;
  }